

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatbase.c
# Opt level: O0

int ecx_LRW(ecx_portt *port,uint32 LogAdr,uint16 length,void *data,int timeout)

{
  byte idx_00;
  uint uVar1;
  int iVar2;
  int wkc;
  uint8 idx;
  int timeout_local;
  void *data_local;
  uint16 length_local;
  uint32 LogAdr_local;
  ecx_portt *port_local;
  
  uVar1 = ecx_getindex(port);
  idx_00 = (byte)uVar1;
  ecx_setupdatagram(port,port->txbuf + idx_00,'\f',idx_00,(uint16)LogAdr,(uint16)(LogAdr >> 0x10),
                    length,data);
  iVar2 = ecx_srconfirm(port,uVar1 & 0xff,timeout);
  if ((0 < iVar2) && (port->rxbuf[idx_00][2] == '\f')) {
    memcpy(data,port->rxbuf[idx_00] + 0xc,(ulong)length);
  }
  ecx_setbufstat(port,uVar1 & 0xff,0);
  return iVar2;
}

Assistant:

int ecx_LRW(ecx_portt *port, uint32 LogAdr, uint16 length, void *data, int timeout)
{
   uint8 idx;
   int wkc;

   idx = ecx_getindex(port);
   ecx_setupdatagram(port, &(port->txbuf[idx]), EC_CMD_LRW, idx, LO_WORD(LogAdr), HI_WORD(LogAdr), length, data);
   wkc = ecx_srconfirm(port, idx, timeout);
   if ((wkc > 0) && (port->rxbuf[idx][EC_CMDOFFSET] == EC_CMD_LRW))
   {
      memcpy(data, &(port->rxbuf[idx][EC_HEADERSIZE]), length);
   }
   ecx_setbufstat(port, idx, EC_BUF_EMPTY);

   return wkc;
}